

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void> kj::anon_unknown_0::expectRead(AsyncInputStream *in,StringPtr expected)

{
  PromiseNode **__return_storage_ptr__;
  size_t sVar1;
  char *pcVar2;
  char *in_RCX;
  Type *func;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar3;
  long *plVar4;
  Promise<void> PVar5;
  Array<char> local_b0;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:417:45),_kj::Array<char>_>
  local_98;
  Promise<unsigned_long> promise;
  Array<char> buffer;
  AsyncInputStream *in_local;
  StringPtr expected_local;
  
  in_local = (AsyncInputStream *)expected.content.size_;
  plVar4 = (long *)expected.content.ptr;
  expected_local.content.ptr = in_RCX;
  expected_local.content.size_ = (size_t)in;
  sVar1 = StringPtr::size((StringPtr *)&in_local);
  if (sVar1 == 0) {
    Promise<void>::Promise((Promise<void> *)in);
    pPVar3 = extraout_RDX;
  }
  else {
    sVar1 = StringPtr::size((StringPtr *)&in_local);
    __return_storage_ptr__ = &promise.super_PromiseBase.node.ptr;
    heapArray<char>((Array<char> *)__return_storage_ptr__,sVar1);
    pcVar2 = Array<char>::begin((Array<char> *)__return_storage_ptr__);
    sVar1 = Array<char>::size((Array<char> *)__return_storage_ptr__);
    func = (Type *)0x1;
    (**(code **)(*plVar4 + 8))(&stack0xffffffffffffffa8,plVar4,pcVar2,1,sVar1);
    local_b0.size_ = (size_t)in_local;
    local_b0.disposer = (ArrayDisposer *)expected_local.content.ptr;
    local_b0.ptr = (char *)plVar4;
    mvCapture<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0,kj::Array<char>&>
              (&local_98,(kj *)&promise.super_PromiseBase.node.ptr,&local_b0,func);
    Promise<unsigned_long>::
    then<kj::CaptureByMove<kj::(anonymous_namespace)::expectRead(kj::AsyncInputStream&,kj::StringPtr)::__0,kj::Array<char>>,kj::_::PropagateException>
              ((Promise<unsigned_long> *)in,
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:417:45),_kj::Array<char>_>
                *)&stack0xffffffffffffffa8,(PropagateException *)&local_98);
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:417:45),_kj::Array<char>_>
    ::~CaptureByMove(&local_98);
    Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffa8);
    Array<char>::~Array((Array<char> *)&promise.super_PromiseBase.node.ptr);
    pPVar3 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = pPVar3;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)in;
  return (Promise<void>)PVar5.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> expectRead(kj::AsyncInputStream& in, kj::StringPtr expected) {
  if (expected.size() == 0) return kj::READY_NOW;

  auto buffer = kj::heapArray<char>(expected.size());

  auto promise = in.tryRead(buffer.begin(), 1, buffer.size());
  return promise.then(kj::mvCapture(buffer, [&in,expected](kj::Array<char> buffer, size_t amount) {
    if (amount == 0) {
      KJ_FAIL_ASSERT("expected data never sent", expected);
    }

    auto actual = buffer.slice(0, amount);
    if (memcmp(actual.begin(), expected.begin(), actual.size()) != 0) {
      KJ_FAIL_ASSERT("data from stream doesn't match expected", expected, actual);
    }

    return expectRead(in, expected.slice(amount));
  }));
}